

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbscurve.cpp
# Opt level: O0

bool __thiscall ON_NurbsCurve::IsNatural(ON_NurbsCurve *this,int end)

{
  byte bVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  double dVar5;
  double dVar6;
  int local_11c;
  int local_114;
  double tol;
  double d2;
  int di;
  int i0;
  undefined1 local_d0 [8];
  ON_BezierCurve span;
  undefined1 auStack_a8 [4];
  int pass;
  ON_Interval domain;
  ON_3dVector D2;
  ON_3dVector D1;
  ON_3dPoint P;
  ON_3dPoint CV2;
  ON_3dPoint CV0;
  bool rc;
  int end_local;
  ON_NurbsCurve *this_local;
  
  bVar1 = 0;
  (*(this->super_ON_Curve).super_ON_Geometry.super_ON_Object._vptr_ON_Object[0x25])();
  span.m_reserved_ON_BezierCurve = (int)(end != 0 && end != 2);
  while( true ) {
    iVar4 = 1;
    if (end == 1 || end == 2) {
      iVar4 = 2;
    }
    bVar2 = bVar1;
    if (iVar4 <= span.m_reserved_ON_BezierCurve) break;
    ON_BezierCurve::ON_BezierCurve((ON_BezierCurve *)local_d0);
    if (span.m_reserved_ON_BezierCurve == 0) {
      local_114 = 0;
    }
    else {
      local_114 = this->m_cv_count - this->m_order;
    }
    bVar3 = ConvertSpanToBezier(this,local_114,(ON_BezierCurve *)local_d0);
    if ((bVar3) && (1 < span.m_dim)) {
      if (span.m_reserved_ON_BezierCurve == 0) {
        local_11c = 0;
      }
      else {
        local_11c = span.m_dim + -1;
      }
      d2._0_4_ = -1;
      if (span.m_reserved_ON_BezierCurve == 0) {
        d2._0_4_ = 1;
      }
      if (2 < span.m_dim) {
        d2._0_4_ = d2._0_4_ << 1;
      }
      bVar3 = ON_BezierCurve::GetCV((ON_BezierCurve *)local_d0,local_11c,(ON_3dPoint *)&CV2.z);
      if (bVar3) {
        bVar3 = ON_BezierCurve::GetCV
                          ((ON_BezierCurve *)local_d0,local_11c + d2._0_4_,(ON_3dPoint *)&P.z);
        if (bVar3) {
          dVar5 = ON_Interval::operator[]((ON_Interval *)auStack_a8,span.m_reserved_ON_BezierCurve);
          ON_Curve::Ev2Der(&this->super_ON_Curve,dVar5,(ON_3dPoint *)&D1.z,(ON_3dVector *)&D2.z,
                           (ON_3dVector *)(domain.m_t + 1),
                           -(uint)(span.m_reserved_ON_BezierCurve != 0) | 1,(int *)0x0);
          dVar5 = ON_3dVector::Length((ON_3dVector *)(domain.m_t + 1));
          dVar6 = ON_3dPoint::DistanceTo((ON_3dPoint *)&CV2.z,(ON_3dPoint *)&P.z);
          if (dVar5 <= dVar6 * 1e-08) {
            bVar1 = 1;
            bVar3 = false;
          }
          else {
            this_local._7_1_ = 0;
            bVar3 = true;
          }
        }
        else {
          this_local._7_1_ = 0;
          bVar3 = true;
        }
      }
      else {
        this_local._7_1_ = 0;
        bVar3 = true;
      }
    }
    else {
      this_local._7_1_ = 0;
      bVar3 = true;
    }
    ON_BezierCurve::~ON_BezierCurve((ON_BezierCurve *)local_d0);
    bVar2 = this_local._7_1_;
    if (bVar3) break;
    span.m_reserved_ON_BezierCurve = span.m_reserved_ON_BezierCurve + 1;
  }
  this_local._7_1_ = bVar2;
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool ON_NurbsCurve::IsNatural(int end) const
{
  bool rc = false;
  ON_3dPoint CV0, CV2, P;
  ON_3dVector D1, D2;
  const ON_Interval domain(Domain());
  for (int pass = ((0==end||2==end) ? 0 : 1); pass < ((1==end||2==end)?2 : 1); ++pass)
  {
    ON_BezierCurve span;
    if (false == ConvertSpanToBezier(((0 == pass) ? 0 : (m_cv_count - m_order)), span) || span.m_order < 2)
      return false;
    int i0 = (0 == pass) ? 0 : span.m_order - 1;
    int di = (0 == pass) ? 1 : -1;
    if (span.m_order > 2)
      di *= 2;
    if (false == span.GetCV(i0, CV0))
      return false;
    if (false == span.GetCV(i0 + di, CV2))
      return false;
    Ev2Der(domain[pass], P, D1, D2, (0 == pass) ? 1 : -1);
    const double d2 = D2.Length();
    const double tol = CV0.DistanceTo(CV2)*1.0e-8;
    if (false == (d2 <= tol))
      return false;
    rc = true;      
  }
  return rc;
}